

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O1

uint32_t __thiscall capnp::StructSchema::Field::getDefaultValueSchemaOffset(Field *this)

{
  uint32_t uVar1;
  PointerReader local_60;
  StructReader local_40;
  
  if ((this->proto)._reader.pointerCount < 4) {
    local_60.nestingLimit = 0x7fffffff;
    local_60.capTable = (CapTableReader *)0x0;
    local_60.pointer = (WirePointer *)0x0;
    local_60.segment = (SegmentReader *)0x0;
  }
  else {
    local_60.nestingLimit = (this->proto)._reader.nestingLimit;
    local_60.segment = (this->proto)._reader.segment;
    local_60.capTable = (this->proto)._reader.capTable;
    local_60.pointer = (this->proto)._reader.pointers + 3;
  }
  _::PointerReader::getStruct(&local_40,&local_60,(word *)0x0);
  uVar1 = Schema::getSchemaOffset((Schema *)this,(Reader *)&local_40);
  return uVar1;
}

Assistant:

uint32_t StructSchema::Field::getDefaultValueSchemaOffset() const {
  return parent.getSchemaOffset(proto.getSlot().getDefaultValue());
}